

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

UVec4 __thiscall
deqp::gles31::Functional::anon_unknown_0::getFloatULPThreshold
          (anon_unknown_0 *this,TextureFormat *sourceFormat,TextureFormat *readPixelsFormat)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Vector<unsigned_int,_4> VVar4;
  UVec4 UVar5;
  Vector<unsigned_int,_4> local_94;
  Vector<unsigned_int,_4> local_84;
  Vector<unsigned_int,_4> local_74;
  Vector<unsigned_int,_4> local_64;
  int local_54;
  undefined1 local_50 [4];
  int i;
  IVec4 ULPDiff;
  IVec4 readMantissaBits;
  IVec4 srcMantissaBits;
  TextureFormat *readPixelsFormat_local;
  TextureFormat *sourceFormat_local;
  
  tcu::getTextureFormatMantissaBitDepth((tcu *)(readMantissaBits.m_data + 2),sourceFormat);
  tcu::getTextureFormatMantissaBitDepth((tcu *)(ULPDiff.m_data + 2),readPixelsFormat);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_50,0);
  for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
    piVar3 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(ULPDiff.m_data + 2),local_54);
    iVar1 = *piVar3;
    piVar3 = tcu::Vector<int,_4>::operator[]
                       ((Vector<int,_4> *)(readMantissaBits.m_data + 2),local_54);
    if (*piVar3 <= iVar1) {
      piVar3 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(ULPDiff.m_data + 2),local_54);
      iVar1 = *piVar3;
      piVar3 = tcu::Vector<int,_4>::operator[]
                         ((Vector<int,_4> *)(readMantissaBits.m_data + 2),local_54);
      iVar2 = *piVar3;
      piVar3 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_50,local_54);
      *piVar3 = iVar1 - iVar2;
    }
  }
  tcu::Vector<unsigned_int,_4>::Vector(&local_64,4);
  tcu::Vector<unsigned_int,_4>::Vector(&local_84,1);
  tcu::Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&local_94);
  tcu::operator<<((tcu *)&local_74,&local_84,&local_94);
  VVar4 = tcu::operator*((tcu *)this,&local_64,&local_74);
  UVar5.m_data._8_8_ = VVar4.m_data._8_8_;
  UVar5.m_data._0_8_ = this;
  return (UVec4)UVar5.m_data;
}

Assistant:

UVec4 getFloatULPThreshold (const tcu::TextureFormat& sourceFormat, const tcu::TextureFormat& readPixelsFormat)
{
	const tcu::IVec4	srcMantissaBits		= tcu::getTextureFormatMantissaBitDepth(sourceFormat);
	const tcu::IVec4	readMantissaBits	= tcu::getTextureFormatMantissaBitDepth(readPixelsFormat);
	tcu::IVec4			ULPDiff(0);

	for (int i = 0; i < 4; i++)
		if (readMantissaBits[i] >= srcMantissaBits[i])
			ULPDiff[i] = readMantissaBits[i] - srcMantissaBits[i];

	return UVec4(4) * (UVec4(1) << (ULPDiff.cast<deUint32>()));
}